

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O0

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0,_1>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherIncr,
               long otherStride,level3_blocking<double,_double> *blocking)

{
  double dVar1;
  double *pdVar2;
  undefined8 uVar3;
  long *plVar4;
  ulong size_00;
  ulong size_01;
  LhsScalar *pLVar5;
  double **ppdVar6;
  ulong *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  double *local_6a8;
  double *local_6a0 [2];
  long local_690;
  bool local_688;
  undefined7 uStack_687;
  long local_680;
  double *local_678;
  double *local_670;
  long local_668;
  bool local_660;
  undefined7 uStack_65f;
  long local_658;
  double *local_650;
  double *local_648;
  double local_640;
  double *local_638;
  double *local_630;
  double local_628;
  double *local_620;
  long local_618;
  double *local_610;
  double *local_608;
  ulong local_600;
  ulong local_5f8;
  double *local_5f0;
  RhsScalar *local_5e8;
  double *local_5e0;
  double *local_5d8;
  double *local_5d0;
  RhsScalar *local_5c8;
  RhsScalar *local_5c0;
  double *local_5b8;
  LhsScalar *local_5b0;
  LhsScalar *local_5a8;
  blas_data_mapper<double,_long,_0,_0,_1> local_5a0;
  const_blas_data_mapper<double,_long,_0> local_590;
  long local_580;
  long local_578;
  long actual_mc;
  long i2;
  long end;
  long start;
  double *local_550;
  const_blas_data_mapper<double,_long,_0> local_548;
  long local_538;
  long startTarget;
  double *local_528;
  long local_520;
  long blockBOffset;
  long startBlock;
  long lengthTarget;
  long i3;
  LinearMapper l;
  LinearMapper r;
  double b;
  double *otherij;
  long j;
  double a;
  long s;
  long rs;
  long i;
  long k;
  long local_4a8;
  long local_4a0;
  long actualPanelWidth;
  long k1;
  long local_488;
  long actual_cols;
  long j2;
  long local_470;
  long actual_kc;
  long k2;
  long local_458;
  ulong local_450;
  long subcols;
  ptrdiff_t l3;
  ptrdiff_t l2;
  ptrdiff_t l1;
  undefined1 local_428 [4];
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  pack_rhs;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  pack_lhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  gebp_kernel;
  conj_if<false> conj;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  undefined1 local_3f8 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeB;
  size_t sizeA;
  long local_3c0;
  long mc;
  long kc;
  OtherMapper other;
  TriMapper tri;
  long cols;
  long otherIncr_local;
  double *_other_local;
  long triStride_local;
  double *_tri_local;
  long otherSize_local;
  long size_local;
  ulong local_350;
  long local_348;
  double *local_340;
  long *local_338;
  long local_330;
  long local_328;
  double *local_320;
  long *local_318;
  double *local_310;
  long local_308;
  long *local_300;
  double *local_2f8;
  long local_2f0;
  long *local_2e8;
  undefined1 local_2e0 [8];
  double *local_2d8;
  long local_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long *local_2b0;
  undefined1 local_2a8 [8];
  long local_2a0;
  long *local_298;
  long local_290;
  LinearMapper *local_288;
  undefined8 local_280;
  long local_278;
  long *local_270;
  undefined1 local_268 [16];
  undefined8 local_258;
  double *local_250;
  double *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  long local_230;
  long *local_228;
  long local_220;
  long local_218;
  long *local_210;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  double *local_1f0;
  long local_1e8;
  undefined1 *local_1e0;
  long local_1d8;
  long local_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long *local_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  double *local_190;
  long local_188;
  undefined1 *local_180;
  long local_178;
  long local_170;
  long *local_168;
  long local_160;
  long local_158;
  long *local_150;
  undefined1 local_148 [16];
  long local_138;
  double *local_130;
  undefined1 *local_128;
  long local_120;
  long local_118;
  long *local_110;
  undefined1 local_108 [16];
  long local_f8;
  double *local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  long local_d8;
  double *local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  long local_b8;
  double *local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  long local_98;
  double *local_90;
  long *local_88;
  undefined8 local_80;
  double *local_78;
  undefined1 *local_70;
  long local_68;
  long local_60;
  long *local_58;
  long local_50;
  long local_48;
  long *local_40;
  long local_38;
  long local_30;
  long *local_28;
  undefined8 local_20;
  long local_18;
  undefined1 *local_10;
  
  ppdVar6 = &local_6a8;
  local_338 = &other.m_stride;
  local_a0 = 1;
  local_318 = &kc;
  local_328 = otherStride;
  other.m_data = (double *)otherStride;
  otherSize_local = size;
  local_348 = triStride;
  local_340 = _tri;
  local_330 = otherIncr;
  local_320 = _other;
  local_98 = triStride;
  local_90 = _tri;
  local_88 = local_338;
  kc = (long)_other;
  other.m_stride = (long)_tri;
  if (otherIncr == 1) {
    mc = level3_blocking<double,_double>::kc(blocking);
    sizeA = level3_blocking<double,_double>::mc(blocking);
    plVar4 = std::min<long>(&otherSize_local,(long *)&sizeA);
    local_3c0 = *plVar4;
    size_00 = mc * local_3c0;
    size_01 = mc * otherSize;
    local_350 = size_00;
    if (0x1fffffffffffffff < size_00) {
      throw_std_bad_alloc();
    }
    pLVar5 = level3_blocking<double,_double>::blockA(blocking);
    if (pLVar5 == (LhsScalar *)0x0) {
      if (size_00 * 8 < 0x20001) {
        lVar8 = -(size_00 * 8 + 0x1e & 0xfffffffffffffff0);
        ppdVar6 = (double **)((long)&local_6a8 + lVar8);
        local_5b0 = (LhsScalar *)((long)local_6a0 + lVar8);
      }
      else {
        local_5b0 = (LhsScalar *)aligned_malloc(size_00 * 8);
      }
      local_5a8 = local_5b0;
    }
    else {
      local_5a8 = level3_blocking<double,_double>::blockA(blocking);
      ppdVar6 = &local_6a8;
    }
    blockA_stack_memory_destructor._16_8_ = local_5a8;
    *(undefined8 *)((long)ppdVar6 + -8) = 0x1d5263;
    pLVar5 = level3_blocking<double,_double>::blockA(blocking);
    if (pLVar5 == (LhsScalar *)0x0) {
      local_5b8 = (double *)blockA_stack_memory_destructor._16_8_;
    }
    else {
      local_5b8 = (double *)0x0;
    }
    pdVar2 = local_5b8;
    *(undefined8 *)((long)ppdVar6 + -8) = 0x1d52b8;
    aligned_stack_memory_handler<double>::aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)local_3f8,pdVar2,size_00,
               0x20000 < size_00 * 8);
    size_local = size_01;
    if (0x1fffffffffffffff < size_01) {
      *(undefined8 *)((long)ppdVar6 + -8) = 0x1d52de;
      throw_std_bad_alloc();
    }
    *(undefined8 *)((long)ppdVar6 + -8) = 0x1d52ed;
    local_5c0 = level3_blocking<double,_double>::blockB(blocking);
    if (local_5c0 == (RhsScalar *)0x0) {
      if (size_01 * 8 < 0x20001) {
        ppdVar6 = (double **)((long)ppdVar6 + -(size_01 * 8 + 0x1e & 0xfffffffffffffff0));
        local_5d8 = (double *)((ulong)((long)ppdVar6 + 0xf) & 0xfffffffffffffff0);
      }
      else {
        *(undefined8 *)((long)ppdVar6 + -8) = 0x1d5379;
        local_5e0 = (double *)aligned_malloc(size_01 * 8);
        local_5d8 = local_5e0;
      }
      local_5d0 = local_5d8;
    }
    else {
      *(undefined8 *)((long)ppdVar6 + -8) = 0x1d530c;
      local_5d0 = level3_blocking<double,_double>::blockB(blocking);
      local_5c8 = local_5d0;
    }
    pdVar2 = local_5d0;
    *(undefined8 *)((long)ppdVar6 + -8) = 0x1d53b7;
    local_5e8 = level3_blocking<double,_double>::blockB(blocking);
    if (local_5e8 == (RhsScalar *)0x0) {
      local_5f0 = pdVar2;
    }
    else {
      local_5f0 = (double *)0x0;
    }
    pdVar11 = local_5f0;
    *(undefined8 *)((long)ppdVar6 + -8) = 0x1d5415;
    aligned_stack_memory_handler<double>::aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)local_428,pdVar11,size_01,
               0x20000 < size_01 * 8);
    *(undefined8 *)((long)ppdVar6 + -8) = 0x1d5433;
    manage_caching_sizes(GetAction,&l2,&l3,&subcols);
    if (otherSize < 1) {
      local_5f8 = 0;
    }
    else {
      local_600 = l3;
      *(undefined8 *)((long)ppdVar6 + -8) = 0x1d545d;
      plVar4 = std::max<long>(&otherStride,&otherSize_local);
      local_5f8 = local_600 / (ulong)(*plVar4 << 5);
    }
    local_450 = local_5f8;
    local_458 = (long)local_5f8 / 4 << 2;
    k2 = 4;
    *(undefined8 *)((long)ppdVar6 + -8) = 0x1d54cf;
    puVar7 = (ulong *)std::max<long>(&local_458,&k2);
    local_450 = *puVar7;
    for (actual_kc = 0; actual_kc < otherSize_local; actual_kc = mc + actual_kc) {
      j2 = otherSize_local - actual_kc;
      *(undefined8 *)((long)ppdVar6 + -8) = 0x1d5520;
      plVar4 = std::min<long>(&j2,&mc);
      local_470 = *plVar4;
      for (actual_cols = 0; actual_cols < otherSize; actual_cols = local_450 + actual_cols) {
        k1 = otherSize - actual_cols;
        *(undefined8 *)((long)ppdVar6 + -8) = 0x1d5571;
        plVar4 = std::min<long>(&k1,(long *)&local_450);
        local_488 = *plVar4;
        for (actualPanelWidth = 0; actualPanelWidth < local_470;
            actualPanelWidth = actualPanelWidth + 4) {
          local_4a8 = local_470 - actualPanelWidth;
          k = 4;
          *(undefined8 *)((long)ppdVar6 + -8) = 0x1d55cd;
          plVar4 = std::min<long>(&local_4a8,&k);
          local_4a0 = *plVar4;
          for (i = 0; lVar10 = local_470, lVar9 = local_488, lVar8 = local_4a0, i < local_4a0;
              i = i + 1) {
            lVar8 = actual_kc + actualPanelWidth + i;
            lVar9 = local_4a0 - i;
            lVar10 = lVar8 + 1;
            for (otherij = (double *)actual_cols; (long)otherij < actual_cols + local_488;
                otherij = (double *)((long)otherij + 1)) {
              local_300 = &kc;
              local_308 = lVar8;
              local_310 = otherij;
              local_608 = (double *)(kc + (lVar8 + (long)otherij * (long)other.m_data) * 8);
              *local_608 = *local_608 * 1.0;
              dVar1 = *local_608;
              local_2e8 = &kc;
              local_2f0 = lVar10;
              local_2f8 = otherij;
              local_2c8 = &kc;
              local_2d0 = lVar10;
              local_2d8 = otherij;
              local_78 = (double *)(kc + (lVar10 + (long)otherij * (long)other.m_data) * 8);
              local_70 = local_2e0;
              local_80 = 1;
              local_610 = local_78;
              l.m_data = local_78;
              local_2b0 = &other.m_stride;
              local_2b8 = lVar10;
              local_2c0 = lVar8;
              local_28 = &other.m_stride;
              local_30 = lVar10;
              local_38 = lVar8;
              local_18 = other.m_stride + (lVar10 + lVar8 * triStride) * 8;
              local_10 = local_2a8;
              local_20 = 1;
              local_618 = local_18;
              i3 = local_18;
              for (lengthTarget = 0; lengthTarget < lVar9 + -1; lengthTarget = lengthTarget + 1) {
                local_298 = &i3;
                local_2a0 = lengthTarget;
                pdVar11 = (double *)(i3 + lengthTarget * 8);
                local_628 = dVar1;
                local_620 = pdVar11;
                *(undefined8 *)((long)ppdVar6 + -8) = 0x1d5932;
                local_630 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar11);
                local_640 = *local_630;
                local_288 = &l;
                local_290 = lengthTarget;
                local_638 = l.m_data + lengthTarget;
                *local_638 = -local_628 * *local_630 + *local_638;
              }
            }
          }
          startBlock = (local_470 - actualPanelWidth) - local_4a0;
          blockBOffset = actual_kc + actualPanelWidth;
          local_520 = actualPanelWidth;
          lVar12 = local_470 * actual_cols;
          local_648 = pdVar2 + lVar12;
          local_1b0 = &kc;
          local_1b8 = blockBOffset;
          local_1c0 = actual_cols;
          local_168 = &kc;
          local_170 = blockBOffset;
          local_178 = actual_cols;
          local_188 = kc + (blockBOffset + actual_cols * (long)other.m_data) * 8;
          local_180 = local_1a8;
          local_190 = other.m_data;
          local_198 = 1;
          local_658 = local_188;
          local_650 = other.m_data;
          startTarget = local_188;
          local_528 = other.m_data;
          *(long *)((long)ppdVar6 + -0x10) = actualPanelWidth;
          *(undefined8 *)((long)ppdVar6 + -0x18) = 0x1d5c10;
          gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
          ::operator()((gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
                        *)((long)&l1 + 4),pdVar2 + lVar12,
                       (blas_data_mapper<double,_long,_0,_0,_1> *)&startTarget,lVar8,lVar9,lVar10,
                       *(long *)((long)ppdVar6 + -0x10));
          uVar3 = blockA_stack_memory_destructor._16_8_;
          lVar9 = local_4a0;
          lVar8 = startBlock;
          if (0 < startBlock) {
            local_538 = actual_kc + actualPanelWidth + local_4a0;
            local_660 = blockA_stack_memory_destructor.m_deallocate;
            uStack_65f = blockA_stack_memory_destructor._17_7_;
            local_110 = &other.m_stride;
            local_118 = local_538;
            local_120 = blockBOffset;
            local_58 = &other.m_stride;
            local_60 = local_538;
            local_68 = blockBOffset;
            local_f0 = (double *)(other.m_stride + (local_538 + blockBOffset * triStride) * 8);
            local_e8 = local_108;
            local_f8 = triStride;
            local_c8 = local_108;
            local_d0 = local_f0;
            local_d8 = triStride;
            local_e0 = 1;
            local_670 = local_f0;
            local_668 = triStride;
            local_548.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data = local_f0;
            local_548.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = triStride;
            *(undefined8 *)((long)ppdVar6 + -0x10) = 0;
            *(undefined8 *)((long)ppdVar6 + -0x18) = 0x1d5dc4;
            gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
            ::operator()((gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
                          *)((long)&l1 + 5),(double *)uVar3,&local_548,lVar9,lVar8,0,
                         *(long *)((long)ppdVar6 + -0x10));
            uVar3 = blockA_stack_memory_destructor._16_8_;
            lVar12 = local_470;
            lVar10 = local_488;
            lVar9 = local_4a0;
            lVar8 = startBlock;
            local_210 = &kc;
            local_218 = local_538;
            local_220 = actual_cols;
            local_1c8 = &kc;
            local_1d0 = local_538;
            local_1d8 = actual_cols;
            local_1e8 = kc + (local_538 + actual_cols * (long)other.m_data) * 8;
            local_1e0 = local_208;
            local_1f0 = other.m_data;
            local_1f8 = 1;
            local_680 = local_1e8;
            local_678 = other.m_data;
            start = local_1e8;
            local_550 = other.m_data;
            lVar13 = local_470 * actual_cols;
            *(long *)((long)ppdVar6 + -0x10) = local_520;
            *(long *)((long)ppdVar6 + -0x20) = lVar12;
            *(long *)((long)ppdVar6 + -0x28) = lVar9;
            *(long *)((long)ppdVar6 + -0x30) = lVar10;
            *(undefined8 *)((long)ppdVar6 + -0x18) = 0;
            *(undefined8 *)((long)ppdVar6 + -0x38) = 0x1d5f69;
            gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
            ::operator()((gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
                          *)((long)&l1 + 6),(blas_data_mapper<double,_long,_0,_0,_1> *)&start,
                         (double *)uVar3,pdVar2 + lVar13,lVar8,lVar9,
                         *(long *)((long)ppdVar6 + -0x30),-1.0,*(long *)((long)ppdVar6 + -0x28),
                         *(long *)((long)ppdVar6 + -0x20),*(long *)((long)ppdVar6 + -0x18),
                         *(long *)((long)ppdVar6 + -0x10));
          }
        }
      }
      i2 = otherSize_local;
      actual_mc = actual_kc + mc;
      end = actual_mc;
      for (; actual_mc < i2; actual_mc = local_3c0 + actual_mc) {
        local_580 = i2 - actual_mc;
        *(undefined8 *)((long)ppdVar6 + -8) = 0x1d6013;
        plVar4 = std::min<long>(&local_3c0,&local_580);
        uVar3 = blockA_stack_memory_destructor._16_8_;
        lVar9 = local_470;
        lVar8 = *plVar4;
        local_578 = lVar8;
        if (0 < lVar8) {
          local_688 = blockA_stack_memory_destructor.m_deallocate;
          uStack_687 = blockA_stack_memory_destructor._17_7_;
          local_150 = &other.m_stride;
          local_158 = actual_mc;
          local_160 = actual_kc;
          local_40 = &other.m_stride;
          local_48 = actual_mc;
          local_50 = actual_kc;
          local_130 = (double *)(other.m_stride + (actual_mc + actual_kc * triStride) * 8);
          local_128 = local_148;
          local_138 = triStride;
          local_a8 = local_148;
          local_b0 = local_130;
          local_b8 = triStride;
          local_c0 = 1;
          local_6a0[1] = local_130;
          local_690 = triStride;
          local_590.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data = local_130;
          local_590.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = triStride;
          *(undefined8 *)((long)ppdVar6 + -0x10) = 0;
          *(undefined8 *)((long)ppdVar6 + -0x18) = 0x1d61af;
          gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
          ::operator()((gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
                        *)((long)&l1 + 5),(double *)uVar3,&local_590,lVar9,lVar8,0,
                       *(long *)((long)ppdVar6 + -0x10));
          uVar3 = blockA_stack_memory_destructor._16_8_;
          lVar9 = local_470;
          lVar8 = local_578;
          local_270 = &kc;
          local_278 = actual_mc;
          local_280 = 0;
          local_228 = &kc;
          local_230 = actual_mc;
          local_238 = 0;
          local_248 = (double *)(kc + actual_mc * 8);
          local_240 = local_268;
          local_250 = other.m_data;
          local_258 = 1;
          local_6a8 = local_248;
          local_6a0[0] = other.m_data;
          local_5a0.m_data = local_248;
          local_5a0.m_stride = (long)other.m_data;
          *(long *)((long)ppdVar6 + -0x30) = otherSize;
          *(undefined8 *)((long)ppdVar6 + -0x10) = 0;
          *(undefined8 *)((long)ppdVar6 + -0x18) = 0;
          *(undefined8 *)((long)ppdVar6 + -0x20) = 0xffffffffffffffff;
          *(undefined8 *)((long)ppdVar6 + -0x28) = 0xffffffffffffffff;
          *(undefined8 *)((long)ppdVar6 + -0x38) = 0x1d633d;
          gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
          ::operator()((gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
                        *)((long)&l1 + 6),&local_5a0,(double *)uVar3,pdVar2,lVar8,lVar9,
                       *(long *)((long)ppdVar6 + -0x30),-1.0,*(long *)((long)ppdVar6 + -0x28),
                       *(long *)((long)ppdVar6 + -0x20),*(long *)((long)ppdVar6 + -0x18),
                       *(long *)((long)ppdVar6 + -0x10));
        }
      }
    }
    *(undefined8 *)((long)ppdVar6 + -8) = 0x1d6389;
    aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)local_428);
    *(undefined8 *)((long)ppdVar6 + -8) = 0x1d6395;
    aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)local_3f8);
    return;
  }
  __assert_fail("incr==1",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/BlasUtil.h"
                ,0xae,
                "Eigen::internal::blas_data_mapper<double, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = double, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
               );
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor,OtherInnerStride>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherIncr, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor, Unaligned, OtherInnerStride> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride, otherIncr);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r(i3);

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar& otherij = other(i,j);
                otherij *= a;
                Scalar b = otherij;
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                typename TriMapper::LinearMapper l = tri.getLinearMapper(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r(i3) -= b * conj(l(i3));
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }